

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSeparateArgumentsCommand.cxx
# Opt level: O3

bool __thiscall
cmSeparateArgumentsCommand::InitialPass
          (cmSeparateArgumentsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pbVar1;
  pointer pcVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  size_type sVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  size_type sVar9;
  pointer pbVar10;
  int iVar11;
  string *vi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string var;
  string command;
  ostringstream e;
  undefined1 local_218 [40];
  string local_1f0;
  char *local_1d0;
  undefined8 local_1c8;
  char local_1c0;
  undefined7 uStack_1bf;
  pointer local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar10 == pbVar1) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"must be given at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    }
    bVar6 = false;
  }
  else {
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    iVar8 = 0;
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    local_1d0 = &local_1c0;
    local_1c8 = 0;
    local_1c0 = '\0';
    iVar11 = 1;
    do {
      if (iVar11 == 3) {
        iVar11 = 0;
        std::__cxx11::string::_M_assign((string *)&local_1d0);
      }
      else if (iVar11 == 2) {
        iVar3 = std::__cxx11::string::compare((char *)pbVar10);
        iVar8 = 1;
        iVar11 = 3;
        if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)pbVar10), iVar3 != 0)) {
          iVar3 = std::__cxx11::string::compare((char *)pbVar10);
          iVar8 = 2;
          if (iVar3 != 0) goto LAB_002eb40f;
        }
      }
      else {
        if (iVar11 != 1) {
LAB_002eb40f:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"given unknown argument ",0x17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)local_218);
          if ((pointer)local_218._0_8_ != (pointer)(local_218 + 0x10)) {
            operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar6 = false;
          goto LAB_002eb646;
        }
        iVar11 = 2;
        std::__cxx11::string::_M_assign((string *)&local_1f0);
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 != pbVar1);
    if (iVar8 == 0) {
      __s = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,&local_1f0);
      bVar6 = true;
      if (__s != (char *)0x0) {
        local_1a8._0_8_ = local_1a8 + 0x10;
        sVar4 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar4);
        if (local_1a8._8_8_ != 0) {
          sVar5 = 0;
          do {
            if (*(char *)(local_1a8._0_8_ + sVar5) == ' ') {
              *(char *)(local_1a8._0_8_ + sVar5) = ';';
            }
            sVar5 = sVar5 + 1;
          } while (local_1a8._8_8_ != sVar5);
        }
        cmMakefile::AddDefinition
                  ((this->super_cmCommand).Makefile,&local_1f0,(char *)local_1a8._0_8_);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
        }
      }
    }
    else {
      local_218._0_8_ = (pointer)0x0;
      local_218._8_8_ = (pointer)0x0;
      local_218._16_8_ = (pointer)0x0;
      if (iVar8 == 1) {
        cmSystemTools::ParseUnixCommandLine
                  (local_1d0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_218);
      }
      else {
        cmSystemTools::ParseWindowsCommandLine
                  (local_1d0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_218);
      }
      local_1a8._0_8_ = local_1a8 + 0x10;
      local_1a8._8_8_ = 0;
      local_1a8[0x10] = '\0';
      local_1b0 = (pointer)local_218._8_8_;
      if (local_218._0_8_ != local_218._8_8_) {
        pbVar10 = (pointer)local_218._0_8_;
        do {
          std::__cxx11::string::append(local_1a8);
          sVar5 = pbVar10->_M_string_length;
          if (sVar5 != 0) {
            pcVar2 = (pbVar10->_M_dataplus)._M_p;
            sVar9 = 0;
            do {
              cVar7 = (char)local_1a8;
              if (pcVar2[sVar9] == ';') {
                std::__cxx11::string::push_back(cVar7);
              }
              std::__cxx11::string::push_back(cVar7);
              sVar9 = sVar9 + 1;
            } while (sVar5 != sVar9);
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 != local_1b0);
      }
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_1f0,(char *)local_1a8._0_8_)
      ;
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_218);
      bVar6 = true;
    }
LAB_002eb646:
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,
                      CONCAT71(local_1f0.field_2._M_allocated_capacity._1_7_,
                               local_1f0.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar6;
}

Assistant:

bool cmSeparateArgumentsCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("must be given at least one argument.");
    return false;
  }

  std::string var;
  std::string command;
  enum Mode
  {
    ModeOld,
    ModeUnix,
    ModeWindows
  };
  Mode mode = ModeOld;
  enum Doing
  {
    DoingNone,
    DoingVariable,
    DoingMode,
    DoingCommand
  };
  Doing doing = DoingVariable;
  for (std::string const& arg : args) {
    if (doing == DoingVariable) {
      var = arg;
      doing = DoingMode;
    } else if (doing == DoingMode && arg == "NATIVE_COMMAND") {
#ifdef _WIN32
      mode = ModeWindows;
#else
      mode = ModeUnix;
#endif
      doing = DoingCommand;
    } else if (doing == DoingMode && arg == "UNIX_COMMAND") {
      mode = ModeUnix;
      doing = DoingCommand;
    } else if (doing == DoingMode && arg == "WINDOWS_COMMAND") {
      mode = ModeWindows;
      doing = DoingCommand;
    } else if (doing == DoingCommand) {
      command = arg;
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "given unknown argument " << arg;
      this->SetError(e.str());
      return false;
    }
  }

  if (mode == ModeOld) {
    // Original space-replacement version of command.
    if (const char* def = this->Makefile->GetDefinition(var)) {
      std::string value = def;
      std::replace(value.begin(), value.end(), ' ', ';');
      this->Makefile->AddDefinition(var, value.c_str());
    }
  } else {
    // Parse the command line.
    std::vector<std::string> vec;
    if (mode == ModeUnix) {
      cmSystemTools::ParseUnixCommandLine(command.c_str(), vec);
    } else // if(mode == ModeWindows)
    {
      cmSystemTools::ParseWindowsCommandLine(command.c_str(), vec);
    }

    // Construct the result list value.
    std::string value;
    const char* sep = "";
    for (std::string const& vi : vec) {
      // Separate from the previous argument.
      value += sep;
      sep = ";";

      // Preserve semicolons.
      for (char si : vi) {
        if (si == ';') {
          value += '\\';
        }
        value += si;
      }
    }
    this->Makefile->AddDefinition(var, value.c_str());
  }

  return true;
}